

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O0

int perform(CURLM *multi)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  int ec_2;
  CURLMcode ec_1;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int local_1bc;
  CURLMcode ec;
  int maxfd;
  timeval interval;
  undefined1 local_1a0 [4];
  int res;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int handles;
  CURLM *multi_local;
  
  interval.tv_usec._4_4_ = 0;
  while( true ) {
    local_1bc = -99;
    _ec = 0;
    interval.tv_sec = 100000;
    iVar2 = curl_multi_perform(multi,(undefined1 *)((long)fdread.__fds_bits + 0x7c));
    uVar1 = _stderr;
    if (iVar2 == 0) {
      if (fdread.__fds_bits[0xf]._4_4_ < 0) {
        curl_mfprintf(_stderr,
                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                      ,0x2d,fdread.__fds_bits[0xf]._4_4_);
        interval.tv_usec._4_4_ = 0x7a;
      }
    }
    else {
      uVar3 = curl_multi_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                    ,0x2d,iVar2,uVar3);
      interval.tv_usec._4_4_ = iVar2;
    }
    if (interval.tv_usec._4_4_ != 0) {
      return interval.tv_usec._4_4_;
    }
    tVar7 = tutil_tvnow();
    older.tv_usec = tv_test_start.tv_usec;
    older.tv_sec = tv_test_start.tv_sec;
    lVar4 = tutil_tvdiff(tVar7,older);
    if (60000 < lVar4) {
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                    ,0x31);
      interval.tv_usec._4_4_ = 0x7d;
    }
    if (interval.tv_usec._4_4_ != 0) {
      return interval.tv_usec._4_4_;
    }
    if (fdread.__fds_bits[0xf]._4_4_ == 0) {
      return 0;
    }
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
    }
    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
      fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
    }
    for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
      *(undefined8 *)(local_1a0 + (ulong)__arr_2._4_4_ * 8) = 0;
    }
    iVar2 = curl_multi_fdset(multi,fdwrite.__fds_bits + 0xf,fdexcep.__fds_bits + 0xf,local_1a0,
                             &local_1bc);
    uVar1 = _stderr;
    if (iVar2 == 0) {
      if (local_1bc < -1) {
        curl_mfprintf(_stderr,
                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                      ,0x3c,local_1bc);
        interval.tv_usec._4_4_ = 0x7a;
      }
    }
    else {
      uVar3 = curl_multi_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                    ,0x3c,iVar2,uVar3);
      interval.tv_usec._4_4_ = iVar2;
    }
    if (interval.tv_usec._4_4_ != 0) break;
    iVar2 = select_wrapper(local_1bc + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                           (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)local_1a0,(timeval *)&ec);
    if (iVar2 == -1) {
      piVar5 = __errno_location();
      uVar1 = _stderr;
      iVar2 = *piVar5;
      pcVar6 = strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                    ,0x42,iVar2,pcVar6);
      interval.tv_usec._4_4_ = 0x79;
    }
    if (interval.tv_usec._4_4_ != 0) {
      return interval.tv_usec._4_4_;
    }
    tVar7 = tutil_tvnow();
    older_00.tv_usec = tv_test_start.tv_usec;
    older_00.tv_sec = tv_test_start.tv_sec;
    lVar4 = tutil_tvdiff(tVar7,older_00);
    if (60000 < lVar4) {
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                    ,0x46);
      interval.tv_usec._4_4_ = 0x7d;
    }
    if (interval.tv_usec._4_4_ != 0) {
      return interval.tv_usec._4_4_;
    }
  }
  return interval.tv_usec._4_4_;
}

Assistant:

static int perform(CURLM *multi)
{
  int handles;
  fd_set fdread, fdwrite, fdexcep;
  int res = 0;

  for(;;) {
    struct timeval interval;
    int maxfd = -99;

    interval.tv_sec = 0;
    interval.tv_usec = 100000L; /* 100 ms */

    res_multi_perform(multi, &handles);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;

    if(!handles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    res_multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);
    if(res)
      return res;

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    res_select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;
  }

  return 0; /* success */
}